

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseDateOrTime(sqlite3_context *context,char *zDate,DateTime *p)

{
  DateTime *z;
  int iVar1;
  double local_30;
  double r;
  DateTime *p_local;
  char *zDate_local;
  sqlite3_context *context_local;
  
  r = (double)p;
  p_local = (DateTime *)zDate;
  zDate_local = (char *)context;
  iVar1 = parseYyyyMmDd(zDate,p);
  if (iVar1 == 0) {
    context_local._4_4_ = 0;
  }
  else {
    iVar1 = parseHhMmSs((char *)p_local,(DateTime *)r);
    if (iVar1 == 0) {
      context_local._4_4_ = 0;
    }
    else {
      iVar1 = sqlite3StrICmp((char *)p_local,"now");
      if ((iVar1 == 0) && (iVar1 = sqlite3NotPureFunc((sqlite3_context *)zDate_local), iVar1 != 0))
      {
        iVar1 = setDateTimeToCurrent((sqlite3_context *)zDate_local,(DateTime *)r);
        return iVar1;
      }
      z = p_local;
      iVar1 = sqlite3Strlen30((char *)p_local);
      iVar1 = sqlite3AtoF((char *)z,&local_30,iVar1,'\x01');
      if (iVar1 == 0) {
        context_local._4_4_ = 1;
      }
      else {
        setRawDateNumber((DateTime *)r,local_30);
        context_local._4_4_ = 0;
      }
    }
  }
  return context_local._4_4_;
}

Assistant:

static int parseDateOrTime(
  sqlite3_context *context, 
  const char *zDate, 
  DateTime *p
){
  double r;
  if( parseYyyyMmDd(zDate,p)==0 ){
    return 0;
  }else if( parseHhMmSs(zDate, p)==0 ){
    return 0;
  }else if( sqlite3StrICmp(zDate,"now")==0 && sqlite3NotPureFunc(context) ){
    return setDateTimeToCurrent(context, p);
  }else if( sqlite3AtoF(zDate, &r, sqlite3Strlen30(zDate), SQLITE_UTF8) ){
    setRawDateNumber(p, r);
    return 0;
  }
  return 1;
}